

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcObjectDefinition::~IfcObjectDefinition(IfcObjectDefinition *this)

{
  pointer pcVar1;
  undefined1 *puVar2;
  
  (this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper
       = (_func_int **)0x912198;
  *(undefined8 *)&(this->super_IfcRoot).field_0x98 = 0x9121c0;
  pcVar1 = (this->super_IfcRoot).Description.ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_IfcRoot).Description.ptr.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->super_IfcRoot).Name.ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_IfcRoot).Name.ptr.field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = *(undefined1 **)
            &(this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
             field_0x10;
  if (puVar2 != &(this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                 field_0x20) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

IfcObjectDefinition() : Object("IfcObjectDefinition") {}